

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Span *pSVar4;
  Entry *pEVar5;
  Data *pDVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  iterator iVar13;
  iterator this;
  iterator iVar14;
  iterator ba;
  pointer pQVar15;
  long *plVar16;
  iterator this_00;
  iterator iVar17;
  QProcess *pQVar18;
  QString *pQVar19;
  ulong uVar20;
  QString *pQVar21;
  char *pcVar22;
  QString *var;
  QRegularExpressionMatch *pQVar23;
  QArrayDataPointer<QString> *this_01;
  QByteArray *line;
  int iVar24;
  long lVar25;
  long in_FS_OFFSET;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QLatin1String QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QAnyStringView QVar40;
  QStringView QVar41;
  QAnyStringView QVar42;
  QAnyStringView QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QAnyStringView QVar46;
  QAnyStringView QVar47;
  QAnyStringView QVar48;
  QAnyStringView QVar49;
  QLatin1String QVar50;
  QLatin1String QVar51;
  QAnyStringView QVar52;
  QAnyStringView QVar53;
  QAnyStringView QVar54;
  QAnyStringView QVar55;
  QAnyStringView QVar56;
  QAnyStringView QVar57;
  QAnyStringView QVar58;
  QAnyStringView QVar59;
  QLatin1StringView latin1;
  initializer_list<QString> args;
  QByteArrayView bv;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  initializer_list<QString> args_00;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  initializer_list<QString> args_01;
  QLatin1StringView latin1_07;
  QLatin1StringView latin1_08;
  QLatin1StringView latin1_09;
  QLatin1StringView latin1_10;
  QLatin1StringView latin1_11;
  QLatin1StringView latin1_12;
  QLatin1StringView latin1_13;
  QLatin1StringView latin1_14;
  QLatin1StringView latin1_15;
  QLatin1StringView latin1_16;
  QLatin1StringView latin1_17;
  initializer_list<QString> args_02;
  QLatin1StringView latin1_18;
  QLatin1StringView latin1_19;
  QLatin1StringView latin1_20;
  initializer_list<QString> args_03;
  QLatin1StringView latin1_21;
  initializer_list<QString> args_04;
  QLatin1StringView latin1_22;
  initializer_list<QString> args_05;
  QLatin1StringView latin1_23;
  QLatin1StringView latin1_24;
  QLatin1StringView latin1_25;
  QLatin1StringView latin1_26;
  QLatin1StringView latin1_27;
  QLatin1StringView latin1_28;
  initializer_list<QString> args_06;
  QLatin1StringView latin1_29;
  QLatin1StringView latin1_30;
  initializer_list<QString> args_07;
  QLatin1StringView latin1_31;
  initializer_list<QString> args_08;
  QLatin1StringView latin1_32;
  initializer_list<QString> args_09;
  undefined1 auVar60 [16];
  QStringView QVar61;
  QLatin1String QVar62;
  QLatin1String QVar63;
  ulong local_338;
  ulong local_330;
  QArrayDataPointer<QString> local_328;
  QArrayDataPointer<char> local_308;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  int argc_local;
  int exitCode;
  QArrayDataPointer<char16_t> local_2b8;
  QArrayDataPointer<QString> local_298;
  QRegularExpression newLoggingFormat;
  QRegularExpression oldFormats;
  QArrayDataPointer<char16_t> local_270;
  QArrayDataPointer<char16_t> local_258;
  QArrayDataPointer<QString> local_238;
  undefined1 local_218 [32];
  char16_t *local_1f8;
  qsizetype qStack_1f0;
  QString local_1e8;
  QString local_1d0;
  QString local_1b8;
  QString local_1a0;
  QString local_188;
  QArrayDataPointer<QString> *local_170;
  QString *local_168;
  ulong uStack_160;
  QString *local_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [8];
  piter local_138 [2];
  piter local_118;
  long local_108;
  QRegularExpressionMatch match_1;
  QArrayDataPointer<char16_t> local_d8;
  bool ok;
  char16_t *pcStack_b0;
  long local_a8;
  undefined1 local_98 [8];
  QString *pQStack_90;
  ulong local_88;
  QRegularExpressionMatch match;
  undefined7 uStack_77;
  QString *pQStack_70;
  char *local_68;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  argc_local = argc;
  signal(2,sigHandler);
  signal(0xf,sigHandler);
  local_2e8 = 0xaaaaaaaaaaaaaaaa;
  uStack_2e0 = 0xaaaaaaaaaaaaaaaa;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_2e8,&argc_local,argv,0x60a00);
  local_58.size = 0xaaaaaaaaaaaaaaaa;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  QCoreApplication::arguments();
  iVar24 = 1;
LAB_001066e7:
  lVar12 = (long)iVar24;
  if (local_58.size <= lVar12) goto LAB_00106a7d;
  pQVar21 = local_58.ptr + lVar12;
  QVar26.m_data = (char *)0x5;
  QVar26.m_size = (qsizetype)pQVar21;
  iVar11 = QString::compare(QVar26,0x10e732);
  if (iVar11 == 0) {
    if (local_58.size != iVar24 + 1) {
      pQVar21 = local_58.ptr + (iVar24 + 1);
      pQVar19 = &g_options.adbCommand;
LAB_001069ac:
      QString::operator=(pQVar19,(QString *)pQVar21);
LAB_001069b1:
      iVar24 = iVar24 + 1;
      goto LAB_001069b4;
    }
  }
  else {
    QVar27.m_data = (char *)0x6;
    QVar27.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar27,0x10e738);
    if (iVar11 == 0) {
      if (local_58.size != iVar24 + 1) {
        pQVar21 = local_58.ptr + (iVar24 + 1);
        pQVar19 = &g_options.buildPath;
        goto LAB_001069ac;
      }
      goto LAB_00106987;
    }
    QVar28.m_data = (char *)0xa;
    QVar28.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar28,0x10e73f);
    if (iVar11 == 0) {
      if (local_58.size != iVar24 + 1) {
        pQVar21 = local_58.ptr + (iVar24 + 1);
        pQVar19 = &g_options.manifestPath;
        goto LAB_001069ac;
      }
      goto LAB_00106987;
    }
    QVar29.m_data = (char *)0x6;
    QVar29.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar29,0x10e74a);
    if (iVar11 == 0) {
      if (local_58.size != iVar24 + 1) {
        pQVar21 = local_58.ptr + (iVar24 + 1);
        pQVar19 = &g_options.makeCommand;
        goto LAB_001069ac;
      }
      goto LAB_00106987;
    }
    QVar30.m_data = (char *)0x5;
    QVar30.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar30,0x10e751);
    if (iVar11 == 0) {
      if (local_58.size != iVar24 + 1) {
        pQVar21 = local_58.ptr + (iVar24 + 1);
        pQVar19 = &g_options.apkPath;
        goto LAB_001069ac;
      }
      goto LAB_00106987;
    }
    QVar31.m_data = (char *)0xa;
    QVar31.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar31,0x10e757);
    if (iVar11 == 0) {
      if (local_58.size != iVar24 + 1) {
        pQVar21 = local_58.ptr + (iVar24 + 1);
        pQVar19 = &g_options.activity;
        goto LAB_001069ac;
      }
      goto LAB_00106987;
    }
    QVar32.m_data = (char *)0x13;
    QVar32.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar32,0x10e762);
    if (iVar11 == 0) {
      g_options.skipAddInstallRoot = true;
      goto LAB_001069b4;
    }
    QVar33.m_data = (char *)0xd;
    QVar33.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar33,0x10e776);
    if (iVar11 == 0) {
      g_options.showLogcatOutput = true;
      goto LAB_001069b4;
    }
    QVar34.m_data = (char *)0xb;
    QVar34.m_size = (qsizetype)pQVar21;
    iVar11 = QString::compare(QVar34,0x10e784);
    if (iVar11 == 0) {
      if (local_58.size != iVar24 + 1) {
        pQVar21 = local_58.ptr + (iVar24 + 1);
        pQVar19 = &g_options.ndkStackPath;
        goto LAB_001069ac;
      }
    }
    else {
      QVar35.m_data = (char *)0x9;
      QVar35.m_size = (qsizetype)pQVar21;
      iVar11 = QString::compare(QVar35,0x10e790);
      if (iVar11 != 0) {
        QVar36.m_data = (char *)0x6;
        QVar36.m_size = (qsizetype)pQVar21;
        iVar11 = QString::compare(QVar36,0x10e79a);
        if (iVar11 == 0) goto LAB_00106987;
        QVar37.m_data = (char *)0x9;
        QVar37.m_size = (qsizetype)pQVar21;
        iVar11 = QString::compare(QVar37,0x10e7a1);
        if (iVar11 != 0) {
          QVar38.m_data = (char *)0x16;
          QVar38.m_size = (qsizetype)pQVar21;
          iVar11 = QString::compare(QVar38,0x10e7ab);
          if (iVar11 == 0) {
            if (local_58.size != iVar24 + 1) {
              QVar61.m_data = (storage_type_conflict *)local_58.ptr[iVar24 + 1].d.size;
              QVar61.m_size = (qsizetype)local_218;
              QProcess::splitCommand(QVar61);
              QList<QList<QString>>::emplaceBack<QList<QString>>
                        ((QList<QList<QString>> *)&g_options.preTestRunAdbCommands,
                         (QList<QString> *)local_218);
              QArrayDataPointer<QString>::~QArrayDataPointer
                        ((QArrayDataPointer<QString> *)local_218);
              goto LAB_001069b1;
            }
            goto LAB_00106987;
          }
          QVar39.m_data = (char *)0x2;
          QVar39.m_size = (qsizetype)pQVar21;
          iVar11 = QString::compare(QVar39,0x10e7c2);
          if (iVar11 != 0) {
            QList<QString>::emplaceBack<QString_const&>
                      (&g_options.testArgsList,local_58.ptr + lVar12);
            goto LAB_001069b4;
          }
          iVar24 = iVar24 + 1;
          goto LAB_00106a7d;
        }
        g_options.verbose = true;
        goto LAB_001069b4;
      }
      if (local_58.size != iVar24 + 1) {
        g_options.timeoutSecs = QString::toInt(local_58.ptr + (iVar24 + 1),(bool *)0x0,10);
        goto LAB_001069b1;
      }
    }
  }
LAB_00106987:
  g_options.helpRequested = true;
LAB_001069b4:
  iVar24 = iVar24 + 1;
  goto LAB_001066e7;
code_r0x0010848c:
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  bVar10 = execAdbCommand(this_00.i,(QByteArray *)&local_58,true);
  if (!bVar10) {
    local_218._0_4_ = 2;
    local_218._4_4_ = 0;
    local_218._8_2_ = L'\0';
    local_218._10_2_ = 0;
    local_218._12_4_ = 0;
    local_218._16_4_ = 0;
    local_218._20_4_ = 0;
    local_218._24_8_ = "default";
    QListSpecialMethods<QString>::join
              ((QString *)local_98,(QListSpecialMethods<QString> *)this_00.i,(QChar)0x20);
    QString::toUtf8_helper((QString *)&match);
    pQVar21 = pQStack_70;
    if (pQStack_70 == (QString *)0x0) {
      pQVar21 = (QString *)&QByteArray::_empty;
    }
    pQVar19 = local_58.ptr;
    if (local_58.ptr == (QString *)0x0) {
      pQVar19 = (QString *)&QByteArray::_empty;
    }
    QMessageLogger::critical
              (local_218,"The pre test ADB command \"%s\" failed with output:\n%s",pQVar21,pQVar19);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&match);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
    iVar24 = -1;
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  this_00.i = (QList<QString> *)((long)this_00.i + 0x18);
  if (!bVar10) goto LAB_00109aab;
  goto LAB_00108483;
LAB_00106a7d:
  if (g_options.skipAddInstallRoot == false) {
    local_218._20_4_ = (uint)((ulong)g_options.makeCommand.d.size >> 0x20) | 0x80000000;
    local_218[0] = (QProcessEnvironment)0x1;
    local_218._8_2_ = SUB82(g_options.makeCommand.d.ptr,0);
    local_218._10_2_ = (undefined2)((ulong)g_options.makeCommand.d.ptr >> 0x10);
    local_218._12_4_ = (undefined4)((ulong)g_options.makeCommand.d.ptr >> 0x20);
    local_218._16_4_ = (undefined4)g_options.makeCommand.d.size;
    local_98 = (undefined1  [8])local_218;
    pQStack_90 = (QString *)0x0;
    QVar40.m_size = (size_t)"%1 INSTALL_ROOT=%2 install";
    QVar40.field_0.m_data = &match;
    QtPrivate::argToQString(QVar40,0x400000000000001a,(ArgBase **)0x1);
    QDir::toNativeSeparators((QString *)local_98);
    QString::arg<QString,_true>
              ((QString *)local_218,(QString *)&match,(QString *)local_98,0,(QChar)0x20);
    pDVar6 = (Data *)CONCAT44(local_218._4_4_,local_218._0_4_);
    pcVar2 = (char16_t *)CONCAT44(local_218._12_4_,CONCAT22(local_218._10_2_,local_218._8_2_));
    local_218._0_4_ = SUB84(g_options.makeCommand.d.d,0);
    local_218._4_4_ = (undefined4)((ulong)g_options.makeCommand.d.d >> 0x20);
    local_218._8_2_ = SUB82(g_options.makeCommand.d.ptr,0);
    local_218._10_2_ = (undefined2)((ulong)g_options.makeCommand.d.ptr >> 0x10);
    local_218._12_4_ = (undefined4)((ulong)g_options.makeCommand.d.ptr >> 0x20);
    qVar7 = CONCAT44(local_218._20_4_,local_218._16_4_);
    local_218._16_4_ = (undefined4)g_options.makeCommand.d.size;
    local_218._20_4_ = (undefined4)((ulong)g_options.makeCommand.d.size >> 0x20);
    g_options.makeCommand.d.d = pDVar6;
    g_options.makeCommand.d.ptr = pcVar2;
    g_options.makeCommand.d.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
  }
  lVar12 = (long)iVar24;
  lVar25 = lVar12 * 0x18;
  for (; lVar12 < local_58.size; lVar12 = lVar12 + 1) {
    QList<QString>::emplaceBack<QString_const&>
              (&g_options.testArgsList,(QString *)((long)&((local_58.ptr)->d).d + lVar25));
    lVar25 = lVar25 + 0x18;
  }
  if (((g_options.helpRequested == false) && (g_options.buildPath.d.size != 0)) &&
     (g_options.apkPath.d.size != 0)) {
    qEnvironmentVariable((char *)local_218);
    pDVar6 = (Data *)CONCAT44(local_218._4_4_,local_218._0_4_);
    pcVar2 = (char16_t *)CONCAT44(local_218._12_4_,CONCAT22(local_218._10_2_,local_218._8_2_));
    local_218._0_4_ = SUB84(g_options.serial.d.d,0);
    local_218._4_4_ = (undefined4)((ulong)g_options.serial.d.d >> 0x20);
    local_218._8_2_ = SUB82(g_options.serial.d.ptr,0);
    local_218._10_2_ = (undefined2)((ulong)g_options.serial.d.ptr >> 0x10);
    local_218._12_4_ = (undefined4)((ulong)g_options.serial.d.ptr >> 0x20);
    qVar7 = CONCAT44(local_218._20_4_,local_218._16_4_);
    local_218._16_4_ = (undefined4)g_options.serial.d.size;
    local_218._20_4_ = (undefined4)((ulong)g_options.serial.d.size >> 0x20);
    g_options.serial.d.d = pDVar6;
    g_options.serial.d.ptr = pcVar2;
    g_options.serial.d.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
    if (g_options.serial.d.size == 0) {
      qEnvironmentVariable((char *)local_218);
      pDVar6 = (Data *)CONCAT44(local_218._4_4_,local_218._0_4_);
      pcVar2 = (char16_t *)CONCAT44(local_218._12_4_,CONCAT22(local_218._10_2_,local_218._8_2_));
      local_218._0_4_ = SUB84(g_options.serial.d.d,0);
      local_218._4_4_ = (undefined4)((ulong)g_options.serial.d.d >> 0x20);
      local_218._8_2_ = SUB82(g_options.serial.d.ptr,0);
      local_218._10_2_ = (undefined2)((ulong)g_options.serial.d.ptr >> 0x10);
      local_218._12_4_ = (undefined4)((ulong)g_options.serial.d.ptr >> 0x20);
      qVar7 = CONCAT44(local_218._20_4_,local_218._16_4_);
      local_218._16_4_ = (undefined4)g_options.serial.d.size;
      local_218._20_4_ = (undefined4)((ulong)g_options.serial.d.size >> 0x20);
      g_options.serial.d.d = pDVar6;
      g_options.serial.d.ptr = pcVar2;
      g_options.serial.d.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
    }
    if (g_options.ndkStackPath.d.size == 0) {
      _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
      qEnvironmentVariable((char *)&match);
      local_88 = 0xaaaaaaaaaaaaaaaa;
      local_98 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
      pQStack_90 = (QString *)0xaaaaaaaaaaaaaaaa;
      local_218._8_2_ = L'/';
      local_218._16_4_ = 9;
      local_218._20_4_ = 0;
      local_218._24_8_ = "ndk-stack";
      local_218._0_8_ = &match;
      QStringBuilder<QStringBuilder<const_QString_&,_QChar>,_QLatin1String>::convertTo<QString>
                ((QString *)local_98,
                 (QStringBuilder<QStringBuilder<const_QString_&,_QChar>,_QLatin1String> *)local_218)
      ;
      cVar9 = QFile::exists((QString *)local_98);
      if (cVar9 != '\0') {
        QString::operator=(&g_options.ndkStackPath,(QString *)local_98);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
    }
    if (g_options.manifestPath.d.size == 0) {
      _match = (QDeadlineTimer *)&g_options.buildPath;
      QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>
                ((QString *)local_218,(QStringBuilder<QString_&,_QLatin1String> *)&match);
      pQVar23 = (QRegularExpressionMatch *)local_218._0_8_;
      pcVar2 = (char16_t *)CONCAT44(local_218._12_4_,CONCAT22(local_218._10_2_,local_218._8_2_));
      local_218._0_4_ = SUB84(g_options.manifestPath.d.d,0);
      local_218._4_4_ = (undefined4)((ulong)g_options.manifestPath.d.d >> 0x20);
      local_218._8_2_ = SUB82(g_options.manifestPath.d.ptr,0);
      local_218._10_2_ = (undefined2)((ulong)g_options.manifestPath.d.ptr >> 0x10);
      local_218._12_4_ = (undefined4)((ulong)g_options.manifestPath.d.ptr >> 0x20);
      qVar7 = CONCAT44(local_218._20_4_,local_218._16_4_);
      local_218._16_4_ = (undefined4)g_options.manifestPath.d.size;
      local_218._20_4_ = (undefined4)((ulong)g_options.manifestPath.d.size >> 0x20);
      g_options.manifestPath.d.d = (Data *)pQVar23;
      g_options.manifestPath.d.ptr = pcVar2;
      g_options.manifestPath.d.size = qVar7;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    if (g_options.makeCommand.d.size != 0) {
      local_308.d = (Data *)0x0;
      local_308.ptr = (char *)0x0;
      local_308.size = 0;
      local_218._16_4_ = 0xaaaaaaaa;
      local_218._20_4_ = 0xaaaaaaaa;
      local_218._0_4_ = 0xaaaaaaaa;
      local_218._4_4_ = 0xaaaaaaaa;
      local_218._8_2_ = L'ꪪ';
      local_218._10_2_ = 0xaaaa;
      local_218._12_4_ = 0xaaaaaaaa;
      QVar41.m_data = (storage_type_conflict *)g_options.makeCommand.d.size;
      QVar41.m_size = (qsizetype)local_218;
      QProcess::splitCommand(QVar41);
      iVar13 = QList<QString>::begin((QList<QString> *)local_218);
      local_58.d = (Data *)((iVar13.i)->d).d;
      local_58.ptr = (QString *)((iVar13.i)->d).ptr;
      local_58.size = ((iVar13.i)->d).size;
      if ((QArrayDataPointer<QString> *)local_58.d != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        *(int *)&((QArrayDataPointer<QString> *)local_58.d)->d =
             *(int *)&((QArrayDataPointer<QString> *)local_58.d)->d + 1;
        UNLOCK();
      }
      iVar24 = -1;
      QtPrivate::sequential_erase_one<QList<QString>,QString>
                ((QList<QString> *)local_218,(QString *)&local_58);
      bVar10 = execCommand((QString *)&local_58,(QStringList *)local_218,(QByteArray *)&local_308,
                           true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_218);
      if (bVar10) {
        cVar9 = QFile::exists((QString *)&g_options.apkPath);
        if (cVar9 == '\0') {
          local_218._0_4_ = 2;
          local_218._20_4_ = 0;
          local_218._4_4_ = 0;
          local_218._8_2_ = L'\0';
          local_218._10_2_ = 0;
          local_218._12_4_ = 0;
          local_218._16_4_ = 0;
          local_218._24_8_ = "default";
          QString::toLocal8Bit((QByteArray *)&local_58,&g_options.apkPath);
          pQVar21 = local_58.ptr;
          if (local_58.ptr == (QString *)0x0) {
            pQVar21 = (QString *)&QByteArray::_empty;
          }
          QMessageLogger::critical
                    (local_218,
                     "No apk \"%s\" found after running the make command. Check the provided path and the make command."
                     ,pQVar21);
          goto LAB_00108e63;
        }
        local_328.size = -0x5555555555555556;
        local_328.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_328.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
        local_218._0_4_ = 0;
        local_218._4_4_ = 0;
        local_218._8_2_ = L'\0';
        local_218._10_2_ = 0;
        local_218._12_4_ = 0;
        local_218._16_4_ = 0;
        local_218._20_4_ = 0;
        latin1.m_data = "devices";
        latin1.m_size = 7;
        QString::QString((QString *)&match,latin1);
        args._M_len = 1;
        args._M_array = (iterator)&match;
        QList<QString>::QList((QList<QString> *)&local_58,args);
        execAdbCommand((QStringList *)&local_58,(QByteArray *)local_218,false);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
        local_328.d = (Data *)0x0;
        local_328.ptr = (QString *)0x0;
        local_328.size = 0;
        QByteArray::split((char)&local_58);
        this = QList<QByteArray>::begin((QList<QByteArray> *)&local_58);
        iVar14 = QList<QByteArray>::end((QList<QByteArray> *)&local_58);
        for (; this.i != iVar14.i; this.i = this.i + 1) {
          bv.m_data = "\tdevice";
          bv.m_size = 7;
          bVar10 = QByteArray::contains(this.i,bv);
          if (bVar10) {
            QByteArray::split((char)(QArrayDataPointer<QByteArray> *)local_98);
            ba = QList<QByteArray>::begin((QList<QByteArray> *)local_98);
            QString::fromUtf8<void>((QString *)&match,ba.i);
            QList<QString>::emplaceBack<QString>((QList<QString> *)&local_328,(QString *)&match);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
            QArrayDataPointer<QByteArray>::~QArrayDataPointer
                      ((QArrayDataPointer<QByteArray> *)local_98);
          }
        }
        QArrayDataPointer<QByteArray>::~QArrayDataPointer
                  ((QArrayDataPointer<QByteArray> *)&local_58);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_218);
        if (local_328.size == 0) {
          local_218._0_4_ = 2;
          local_218._20_4_ = 0;
          local_218._4_4_ = 0;
          local_218._8_2_ = L'\0';
          local_218._10_2_ = 0;
          local_218._12_4_ = 0;
          local_218._16_4_ = 0;
          local_218._24_8_ = "default";
          QMessageLogger::critical
                    (local_218,"No connected devices or running emulators can be found.");
LAB_0010835e:
          iVar24 = -1;
        }
        else {
          if ((g_options.serial.d.size != 0) &&
             (bVar10 = QListSpecialMethods<QString>::contains
                                 ((QListSpecialMethods<QString> *)&local_328,&g_options.serial,
                                  CaseSensitive), !bVar10)) {
            local_218._0_4_ = 2;
            local_218._20_4_ = 0;
            local_218._4_4_ = 0;
            local_218._8_2_ = L'\0';
            local_218._10_2_ = 0;
            local_218._12_4_ = 0;
            local_218._16_4_ = 0;
            local_218._24_8_ = "default";
            QString::toLocal8Bit((QByteArray *)&local_58,&g_options.serial);
            pQVar21 = local_58.ptr;
            if (local_58.ptr == (QString *)0x0) {
              pQVar21 = (QString *)&QByteArray::_empty;
            }
            pcVar22 = "No connected device or running emulator with serial \'%s\' can be found.";
LAB_00108fac:
            QMessageLogger::critical(local_218,pcVar22,pQVar21);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
            goto LAB_0010835e;
          }
          local_58.size = 0;
          local_58.d = (Data *)0x0;
          local_58.ptr = (QString *)0x0;
          _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
          latin1_00.m_data = "shell";
          latin1_00.m_size = 5;
          QString::QString((QString *)local_218,latin1_00);
          latin1_01.m_data = "getprop";
          latin1_01.m_size = 7;
          QString::QString((QString *)(local_218 + 0x18),latin1_01);
          latin1_02.m_data = "ro.build.version.sdk";
          latin1_02.m_size = 0x14;
          QString::QString(&local_1e8,latin1_02);
          args_00._M_len = 3;
          args_00._M_array = (QString *)local_218;
          QList<QString>::QList((QList<QString> *)&match,args_00);
          lVar12 = 0x30;
          do {
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
            lVar12 = lVar12 + -0x18;
          } while (lVar12 != -0x18);
          execAdbCommand((QStringList *)&match,(QByteArray *)&local_58,false);
          _ok = (QArrayDataPointer<QString> *)((ulong)_ok & 0xffffffffffffff00);
          iVar24 = QByteArray::toInt((bool *)&local_58,(int)&ok);
          if (ok != true) {
            local_218._0_4_ = 2;
            local_218._20_4_ = 0;
            local_218._4_4_ = 0;
            local_218._8_2_ = L'\0';
            local_218._10_2_ = 0;
            local_218._12_4_ = 0;
            local_218._16_4_ = 0;
            local_218._24_8_ = "default";
            QMessageLogger::critical();
            QDebug::operator<<((QDebug *)local_98,"Unable to obtain the SDK version of the target.")
            ;
            QDebug::~QDebug((QDebug *)local_98);
            iVar24 = g_testInfo.sdkVersion;
          }
          g_testInfo.sdkVersion = iVar24;
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&match);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
          local_58.size = 0;
          local_58.d = (Data *)0x0;
          local_58.ptr = (QString *)0x0;
          if (g_testInfo.sdkVersion < 0x1a) {
LAB_001071dd:
            QByteArray::operator=((QByteArray *)&local_58,"0");
          }
          else {
            _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
            latin1_03.m_data = "shell";
            latin1_03.m_size = 5;
            QString::QString((QString *)local_218,latin1_03);
            latin1_04.m_data = "cmd";
            latin1_04.m_size = 3;
            QString::QString((QString *)(local_218 + 0x18),latin1_04);
            latin1_05.m_data = "activity";
            latin1_05.m_size = 8;
            QString::QString(&local_1e8,latin1_05);
            latin1_06.m_data = "get-current-user";
            latin1_06.m_size = 0x10;
            QString::QString(&local_1d0,latin1_06);
            args_01._M_len = 4;
            args_01._M_array = (QString *)local_218;
            QList<QString>::QList((QList<QString> *)&match,args_01);
            lVar12 = 0x48;
            do {
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
              lVar12 = lVar12 + -0x18;
            } while (lVar12 != -0x18);
            bVar10 = execAdbCommand((QStringList *)&match,(QByteArray *)&local_58,false);
            if (!bVar10) {
              local_218._0_4_ = 2;
              local_218._20_4_ = 0;
              local_218._4_4_ = 0;
              local_218._8_2_ = L'\0';
              local_218._10_2_ = 0;
              local_218._12_4_ = 0;
              local_218._16_4_ = 0;
              local_218._24_8_ = "default";
              QMessageLogger::critical();
              QDebug::operator<<((QDebug *)local_98,"Error: failed to retrieve the user ID");
              QDebug::~QDebug((QDebug *)local_98);
              QByteArray::clear();
            }
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&match);
            if (local_58.size == 0) goto LAB_001071dd;
          }
          QByteArray::simplified_helper((QByteArray *)local_218);
          QString::fromUtf8<void>((QString *)&match,(QByteArray *)local_218);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_218);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
          local_68 = (char *)g_testInfo.userId.d.size;
          pDVar6 = g_testInfo.userId.d.d;
          g_testInfo.userId.d.d = (Data *)_match;
          g_testInfo.userId.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          _match = (QDeadlineTimer *)pDVar6;
          g_testInfo.userId.d.size = -0x5555555555555556;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
          cVar9 = QFile::exists((QString *)&g_options.manifestPath);
          if (cVar9 == '\0') {
            local_218._0_4_ = 2;
            local_218._20_4_ = 0;
            local_218._4_4_ = 0;
            local_218._8_2_ = L'\0';
            local_218._10_2_ = 0;
            local_218._12_4_ = 0;
            local_218._16_4_ = 0;
            local_218._24_8_ = "default";
            QString::toLocal8Bit((QByteArray *)&local_58,&g_options.manifestPath);
            pQVar21 = local_58.ptr;
            if (local_58.ptr == (QString *)0x0) {
              pQVar21 = (QString *)&QByteArray::_empty;
            }
            pcVar22 = "Unable to find \'%s\'.";
            goto LAB_00108fac;
          }
          _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
          QFile::QFile((QFile *)&match,(QString *)&g_options.manifestPath);
          cVar9 = QFile::open((QFile *)&match,1);
          if (cVar9 == '\0') {
LAB_001073c9:
            local_58.d = (Data *)0x0;
            local_58.ptr = (QString *)0x0;
            local_58.size = 0;
          }
          else {
            _ok = (QArrayDataPointer<QString> *)0xaaaaaaaaaaaaaaaa;
            QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&ok,(QIODevice *)&match);
            do {
              do {
                cVar9 = QXmlStreamReader::atEnd();
                if (cVar9 != '\0') {
                  QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&ok);
                  goto LAB_001073c9;
                }
                QXmlStreamReader::readNext();
                bVar10 = QXmlStreamReader::isStartElement((QXmlStreamReader *)&ok);
              } while (!bVar10);
              auVar60 = QXmlStreamReader::name();
              local_218._0_4_ = auVar60._0_4_;
              local_218._4_4_ = auVar60._4_4_;
              local_218._8_2_ = auVar60._8_2_;
              local_218._10_2_ = auVar60._10_2_;
              local_218._12_4_ = auVar60._12_4_;
              local_58.d = (Data *)0x8;
              local_58.ptr = (QString *)0x10e741;
              bVar10 = comparesEqual((QLatin1StringView *)&local_58,(QStringView *)local_218);
            } while (!bVar10);
            QXmlStreamReader::attributes();
            QVar42.m_size = (size_t)"package";
            QVar42.field_0.m_data = local_218;
            _local_98 = (QStringView)QXmlStreamAttributes::value(QVar42);
            QStringView::toString((QString *)&local_58,(QStringView *)local_98);
            QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                      ((QArrayDataPointer<QXmlStreamAttribute> *)local_218);
            QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&ok);
          }
          QFile::~QFile((QFile *)&match);
          qVar7 = g_options.package.d.size;
          pcVar2 = g_options.package.d.ptr;
          pDVar6 = g_options.package.d.d;
          g_options.package.d.d = (Data *)local_58.d;
          g_options.package.d.ptr = (char16_t *)local_58.ptr;
          local_58.d = (Data *)pDVar6;
          local_58.ptr = (QString *)pcVar2;
          g_options.package.d.size = local_58.size;
          local_58.size = qVar7;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
          if (g_options.activity.d.size == 0) {
            _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
            QFile::QFile((QFile *)&match,(QString *)&g_options.manifestPath);
            cVar9 = QFile::open((QFile *)&match,1);
            if (cVar9 == '\0') {
LAB_0010761d:
              local_58.d = (Data *)0x0;
              local_58.ptr = (QString *)0x0;
              local_58.size = 0;
            }
            else {
              _ok = (QArrayDataPointer<QString> *)0xaaaaaaaaaaaaaaaa;
              QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&ok,(QIODevice *)&match);
              do {
                do {
                  cVar9 = QXmlStreamReader::atEnd();
                  if (cVar9 != '\0') {
                    QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&ok);
                    goto LAB_0010761d;
                  }
                  QXmlStreamReader::readNext();
                  bVar10 = QXmlStreamReader::isStartElement((QXmlStreamReader *)&ok);
                } while (!bVar10);
                auVar60 = QXmlStreamReader::name();
                local_218._0_4_ = auVar60._0_4_;
                local_218._4_4_ = auVar60._4_4_;
                local_218._8_2_ = auVar60._8_2_;
                local_218._10_2_ = auVar60._10_2_;
                local_218._12_4_ = auVar60._12_4_;
                local_58.d = (Data *)0x8;
                local_58.ptr = (QString *)0x10e759;
                bVar10 = comparesEqual((QLatin1StringView *)&local_58,(QStringView *)local_218);
              } while (!bVar10);
              QXmlStreamReader::attributes();
              QVar43.m_size = (size_t)"android:name";
              QVar43.field_0.m_data = local_218;
              QVar61 = (QStringView)QXmlStreamAttributes::value(QVar43);
              _local_98 = QVar61;
              QStringView::toString((QString *)&local_58,(QStringView *)local_98);
              QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                        ((QArrayDataPointer<QXmlStreamAttribute> *)local_218);
              QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&ok);
            }
            QFile::~QFile((QFile *)&match);
            qVar7 = g_options.activity.d.size;
            pcVar2 = g_options.activity.d.ptr;
            pDVar6 = g_options.activity.d.d;
            g_options.activity.d.d = (Data *)local_58.d;
            g_options.activity.d.ptr = (char16_t *)local_58.ptr;
            local_58.d = (Data *)pDVar6;
            local_58.ptr = (QString *)pcVar2;
            g_options.activity.d.size = local_58.size;
            local_58.size = qVar7;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
          }
          pQStack_70 = (QString *)0xaaaaaaaaaaaaaaaa;
          _oldFormats = 0xaaaaaaaaaaaaaaaa;
          latin1_07.m_data = "^-(txt|csv|xunitxml|junitxml|xml|lightxml|teamcity|tap)$";
          latin1_07.m_size = 0x38;
          QString::QString((QString *)local_218,latin1_07);
          iVar24 = 0;
          QRegularExpression::QRegularExpression
                    (&oldFormats,(QArrayDataPointer<char16_t> *)local_218,0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
          _newLoggingFormat = 0xaaaaaaaaaaaaaaaa;
          latin1_08.m_data = "^(.*),(txt|csv|xunitxml|junitxml|xml|lightxml|teamcity|tap)$";
          latin1_08.m_size = 0x3c;
          QString::QString((QString *)local_218,latin1_08);
          QRegularExpression::QRegularExpression
                    (&newLoggingFormat,(QArrayDataPointer<char16_t> *)local_218,0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
          local_88 = 0;
          local_a8 = 0;
          local_98 = (undefined1  [8])0x0;
          pQStack_90 = (QString *)0x0;
          _ok = (QArrayDataPointer<QString> *)0x0;
          pcStack_b0 = (char16_t *)0x0;
          local_238.d = (Data *)0x0;
          local_238.ptr = (QString *)0x0;
          local_238.size = 0;
          local_330 = 0x4000000000000007;
          while( true ) {
            lVar12 = (long)iVar24;
            local_338 = g_options.testArgsList.d.size;
            if (g_options.testArgsList.d.size <= lVar12) break;
            QList<QString>::data(&g_options.testArgsList);
            QString::trimmed_helper((QString *)&local_58);
            local_218._0_4_ = 2;
            local_218._4_4_ = 0;
            local_218._8_2_ = L'\xe7c2';
            local_218._10_2_ = 0x10;
            local_218._12_4_ = 0;
            bVar10 = operator==((QString *)&local_58,(QLatin1StringView *)local_218);
            if (!bVar10) {
              local_218._0_4_ = 2;
              local_218._4_4_ = 0;
              local_218._8_2_ = L'\xf031';
              local_218._10_2_ = 0x10;
              local_218._12_4_ = 0;
              bVar10 = operator==((QString *)&local_58,(QLatin1StringView *)local_218);
              if (bVar10) {
                if (g_options.testArgsList.d.size + -1 <= lVar12) {
                  this_01 = &local_58;
                  goto LAB_00108312;
                }
                iVar24 = iVar24 + 1;
                pQVar15 = QList<QString>::data(&g_options.testArgsList);
                _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
                QRegularExpression::match(&match,&newLoggingFormat,pQVar15 + iVar24,0,0,0);
                cVar9 = QRegularExpressionMatch::hasMatch();
                if (cVar9 == '\0') {
                  QString::operator=((QString *)local_98,(QString *)(pQVar15 + iVar24));
                }
                else {
                  local_218._16_4_ = 0xaaaaaaaa;
                  local_218._20_4_ = 0xaaaaaaaa;
                  local_218._0_4_ = 0xaaaaaaaa;
                  local_218._4_4_ = 0xaaaaaaaa;
                  local_218._8_2_ = L'ꪪ';
                  local_218._10_2_ = 0xaaaa;
                  local_218._12_4_ = 0xaaaaaaaa;
                  QRegularExpressionMatch::capturedTexts();
                  lVar12 = CONCAT44(local_218._12_4_,CONCAT22(local_218._10_2_,local_218._8_2_));
                  local_258.d = *(Data **)(lVar12 + 0x18);
                  local_258.ptr = *(char16_t **)(lVar12 + 0x20);
                  local_258.size = *(long *)(lVar12 + 0x28);
                  if (local_258.d != (Data *)0x0) {
                    LOCK();
                    ((local_258.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_258.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                    lVar12 = CONCAT44(local_218._12_4_,CONCAT22(local_218._10_2_,local_218._8_2_));
                  }
                  local_270.d = *(Data **)(lVar12 + 0x30);
                  local_270.ptr = *(char16_t **)(lVar12 + 0x38);
                  local_270.size = *(qsizetype *)(lVar12 + 0x40);
                  if (local_270.d != (Data *)0x0) {
                    LOCK();
                    ((local_270.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_270.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                  }
                  setOutputFile((QString *)&local_258,(QString *)&local_270);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_258);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_218);
                }
                pQVar23 = &match;
              }
              else {
                _match_1 = (QArrayDataPointer<QString> *)0xaaaaaaaaaaaaaaaa;
                QRegularExpression::match(&match_1,&oldFormats,&local_58,0,0,0);
                cVar9 = QRegularExpressionMatch::hasMatch();
                if (cVar9 == '\0') {
                  _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
                  local_218._0_4_ = SUB84(local_58.d,0);
                  local_218._4_4_ = (undefined4)((ulong)local_58.d >> 0x20);
                  local_218._8_2_ = SUB82(local_58.ptr,0);
                  local_218._10_2_ = (undefined2)((ulong)local_58.ptr >> 0x10);
                  local_218._12_4_ = (undefined4)((ulong)local_58.ptr >> 0x20);
                  local_218._16_4_ = (undefined4)local_58.size;
                  local_218._20_4_ = (undefined4)((ulong)local_58.size >> 0x20);
                  if ((QArrayDataPointer<QString> *)local_58.d != (QArrayDataPointer<QString> *)0x0)
                  {
                    LOCK();
                    *(int *)&(local_58.d)->super_QArrayData =
                         *(int *)&(local_58.d)->super_QArrayData + 1;
                    UNLOCK();
                  }
                  QVar44.m_data = (char *)0x1;
                  QVar44.m_size = (qsizetype)local_218;
                  QVar62.m_data = (char *)0x6;
                  QVar62.m_size = (qsizetype)"\"";
                  plVar16 = (long *)QString::replace(QVar44,QVar62,0x10f034);
                  _match = (QDeadlineTimer *)*plVar16;
                  pQStack_70 = (QString *)plVar16[1];
                  local_68 = (char *)plVar16[2];
                  if (_match != (QDeadlineTimer *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)_match)->d).d = *(int *)&(((QString *)_match)->d).d + 1;
                    UNLOCK();
                  }
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_218);
                  QVar45.m_data = (char *)0x1;
                  QVar45.m_size = (qsizetype)&match;
                  QVar63.m_data = (char *)0x1;
                  QVar63.m_size = (qsizetype)"\'";
                  QString::replace(QVar45,QVar63,0x10e68e);
                  local_218._20_4_ = (uint)((ulong)local_68 >> 0x20) | 0x80000000;
                  local_218[0] = (QProcessEnvironment)0x1;
                  local_218._8_2_ = SUB82(pQStack_70,0);
                  local_218._10_2_ = (undefined2)((ulong)pQStack_70 >> 0x10);
                  local_218._12_4_ = (undefined4)((ulong)pQStack_70 >> 0x20);
                  local_218._16_4_ = SUB84(local_68,0);
                  local_d8.ptr = (char16_t *)0x0;
                  QVar46.m_size = (size_t)" \\\"%1\\\"";
                  QVar46.field_0.m_data = &local_298;
                  local_d8.d = (Data *)local_218;
                  QtPrivate::argToQString(QVar46,local_330,(ArgBase **)0x1);
                  QList<QString>::emplaceBack<QString>
                            ((QList<QString> *)&local_238,(QString *)&local_298);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_298);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&match);
                }
                else {
                  QRegularExpressionMatch::capturedTexts();
                  QString::operator=((QString *)&ok,
                                     (QString *)
                                     (CONCAT44(local_218._12_4_,
                                               CONCAT22(local_218._10_2_,local_218._8_2_)) + 0x18));
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_218);
                }
                pQVar23 = &match_1;
              }
              QRegularExpressionMatch::~QRegularExpressionMatch(pQVar23);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_58);
            iVar24 = iVar24 + 1;
          }
          uVar20 = local_88;
          if (((g_options.outFiles.d == (Data *)0x0) || ((g_options.outFiles.d)->size == 0)) ||
             (local_88 != 0)) {
LAB_00107b77:
            local_298.d = (Data *)local_98;
            local_298.ptr = pQStack_90;
            if (local_98 != (undefined1  [8])0x0) {
              LOCK();
              (((QArrayData *)local_98)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)local_98)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_d8.d = (Data *)_ok;
            local_d8.ptr = pcStack_b0;
            local_d8.size = local_a8;
            if (_ok != (QArrayDataPointer<QString> *)0x0) {
              LOCK();
              *(int *)&_ok->d = *(int *)&_ok->d + 1;
              UNLOCK();
            }
            local_298.size = uVar20;
            setOutputFile((QString *)&local_298,(QString *)&local_d8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_298);
          }
          else if (local_a8 != 0) {
            uVar20 = 0;
            goto LAB_00107b77;
          }
          _match_1 = (QArrayDataPointer<QString> *)0x0;
          local_138[0] = (piter)QHash<QString,_QString>::constBegin(&g_options.outFiles);
          while( true ) {
            if (local_138[0].d == (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 &&
                local_138[0].bucket == 0) break;
            pSVar4 = (local_138[0].d)->spans;
            uVar20 = local_138[0].bucket >> 7;
            QFileInfo::QFileInfo
                      ((QFileInfo *)&exitCode,
                       (QString *)
                       (pSVar4[uVar20].entries
                        [pSVar4[uVar20].offsets[(uint)local_138[0].bucket & 0x7f]].storage.data +
                       0x18));
            QFileInfo::fileName();
            pEVar5 = (local_138[0].d)->spans[local_138[0].bucket >> 7].entries;
            bVar1 = (local_138[0].d)->spans[local_138[0].bucket >> 7].offsets
                    [(uint)local_138[0].bucket & 0x7f];
            local_58.size = local_2b8.size | 0x8000000000000000;
            local_58.d = (Data *)CONCAT71(local_58.d._1_7_,1);
            local_58.ptr = (QString *)local_2b8.ptr;
            pQStack_70 = *(QString **)(pEVar5[bVar1].storage.data + 8);
            local_68 = (char *)(*(ulong *)(pEVar5[bVar1].storage.data + 0x10) | 0x8000000000000000);
            _match = (QDeadlineTimer *)CONCAT71(uStack_77,1);
            local_218._0_8_ = &local_58;
            local_218._8_2_ = SUB82(&match,0);
            local_218._10_2_ = (undefined2)((ulong)&match >> 0x10);
            local_218._12_4_ = (undefined4)((ulong)&match >> 0x20);
            local_218._16_4_ = 0;
            local_218._20_4_ = 0;
            QVar47.m_size = (size_t)"-o %1,%2 ";
            QVar47.field_0.m_data = &local_118;
            QtPrivate::argToQString(QVar47,0x4000000000000009,(ArgBase **)0x2);
            QString::append((QString *)&match_1);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_118);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
            QFileInfo::~QFileInfo((QFileInfo *)&exitCode);
            QHashPrivate::iterator<QHashPrivate::Node<QString,_QString>_>::operator++(local_138);
          }
          QListSpecialMethods<QString>::join
                    ((QString *)&local_58,(QListSpecialMethods<QString> *)&local_238,(QChar)0x20);
          QString::trimmed_helper((QString *)local_218);
          QString::append((QString *)&match_1);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
          QString::trimmed_helper((QString *)&match);
          local_218._20_4_ = (uint)((ulong)local_68 >> 0x20) | 0x80000000;
          local_218[0] = (QProcessEnvironment)0x1;
          local_218._8_2_ = SUB82(pQStack_70,0);
          local_218._10_2_ = (undefined2)((ulong)pQStack_70 >> 0x10);
          local_218._12_4_ = (undefined4)((ulong)pQStack_70 >> 0x20);
          local_218._16_4_ = SUB84(local_68,0);
          local_118.bucket = 0;
          local_118.d = (Data<QHashPrivate::Node<QString,_QString>_> *)local_218;
          QVar48.m_size = (size_t)"\"%1\"";
          QVar48.field_0.m_data = &local_58;
          QtPrivate::argToQString(QVar48,0x4000000000000004,(ArgBase **)0x1);
          qVar7 = local_58.size;
          pQVar21 = local_58.ptr;
          pDVar8 = (Data *)_match_1;
          _match_1 = (QArrayDataPointer<QString> *)local_58.d;
          local_58.d = pDVar8;
          local_58.ptr = (QString *)0x0;
          local_58.size = 0;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
          local_58.size = 0xaaaaaaaaaaaaaaaa;
          local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
          local_218._20_4_ = (uint)((ulong)g_options.package.d.size >> 0x20) | 0x80000000;
          local_218[0] = (QProcessEnvironment)0x1;
          local_218._8_2_ = SUB82(g_options.package.d.ptr,0);
          local_218._10_2_ = (undefined2)((ulong)g_options.package.d.ptr >> 0x10);
          local_218._12_4_ = (undefined4)((ulong)g_options.package.d.ptr >> 0x20);
          local_218._16_4_ = (undefined4)g_options.package.d.size;
          local_118.bucket = 0;
          local_118.d = (Data<QHashPrivate::Node<QString,_QString>_> *)local_218;
          QVar49.m_size = (size_t)"%1/%2";
          QVar49.field_0.m_data = &match;
          QtPrivate::argToQString(QVar49,0x4000000000000005,(ArgBase **)0x1);
          QString::arg<QString,_true>
                    ((QString *)&local_58,(QString *)&match,&g_options.activity,0,(QChar)0x20);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
          _match = (QDeadlineTimer *)0x0;
          local_108 = -0x5555555555555556;
          local_118.bucket = 0xaaaaaaaaaaaaaaaa;
          local_118.d = (Data<QHashPrivate::Node<QString,_QString>_> *)0xaaaaaaaaaaaaaaaa;
          QProcessEnvironment::systemEnvironment();
          QProcessEnvironment::toStringList();
          QProcessEnvironment::~QProcessEnvironment((QProcessEnvironment *)local_218);
          pQVar19 = (QString *)local_118.bucket;
          for (lVar25 = local_108 * 0x18; lVar25 != 0; lVar25 = lVar25 + -0x18) {
            QVar50.m_data = (char *)0x6;
            QVar50.m_size = (qsizetype)pQVar19;
            cVar9 = QString::startsWith(QVar50,0x10f058);
            if ((cVar9 != '\0') ||
               (QVar51.m_data = (char *)0x3, QVar51.m_size = (qsizetype)pQVar19,
               cVar9 = QString::startsWith(QVar51,0x10f05f), cVar9 != '\0')) {
              pcVar2 = (pQVar19->d).ptr;
              qVar3 = (pQVar19->d).size;
              local_218._20_4_ = (uint)((ulong)qVar3 >> 0x20) | 0x80000000;
              local_218[0] = (QProcessEnvironment)0x1;
              local_218._8_2_ = SUB82(pcVar2,0);
              local_218._10_2_ = (undefined2)((ulong)pcVar2 >> 0x10);
              local_218._12_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
              local_218._16_4_ = (undefined4)qVar3;
              local_138[0].bucket = 0;
              local_138[0].d = (Data<QHashPrivate::Node<QString,_QString>_> *)local_218;
              QVar52.m_size = (size_t)"%1 ";
              QVar52.field_0.m_data = &local_2b8;
              QtPrivate::argToQString(QVar52,0x4000000000000003,(ArgBase **)0x1);
              QString::append((QString *)&match);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
            }
            pQVar19 = pQVar19 + 1;
          }
          pQStack_70 = (QString *)0x0;
          latin1_09.m_data = "shell";
          latin1_09.m_size = 5;
          QString::QString((QString *)local_218,latin1_09);
          latin1_10.m_data = "am";
          latin1_10.m_size = 2;
          QString::QString((QString *)(local_218 + 0x18),latin1_10);
          latin1_11.m_data = "start";
          latin1_11.m_size = 5;
          QString::QString(&local_1e8,latin1_11);
          latin1_12.m_data = "-n";
          latin1_12.m_size = 2;
          QString::QString(&local_1d0,latin1_12);
          local_1b8.d.d = (Data *)local_58.d;
          local_1b8.d.ptr = (char16_t *)local_58.ptr;
          local_1b8.d.size = local_58.size;
          if ((QArrayDataPointer<QString> *)local_58.d != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            *(int *)&(local_58.d)->super_QArrayData = *(int *)&(local_58.d)->super_QArrayData + 1;
            UNLOCK();
          }
          latin1_13.m_data = "-e";
          latin1_13.m_size = 2;
          QString::QString(&local_1a0,latin1_13);
          latin1_14.m_data = "applicationArguments";
          latin1_14.m_size = 0x14;
          QString::QString(&local_188,latin1_14);
          local_170 = _match_1;
          local_168 = pQVar21;
          uStack_160 = qVar7;
          if (_match_1 != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            *(int *)&_match_1->d = *(int *)&_match_1->d + 1;
            UNLOCK();
          }
          local_158 = (QString *)_match;
          local_150 = 0;
          uStack_14c = 0;
          uStack_148 = 0;
          uStack_144 = 0;
          if (_match != (QDeadlineTimer *)0x0) {
            LOCK();
            *(int *)&(((QString *)_match)->d).d = *(int *)&(((QString *)_match)->d).d + 1;
            UNLOCK();
          }
          QArrayDataPointer<QString>::assign<QString_const*,q20::identity>
                    (&g_options.amStarttestArgs.d,local_218,local_140);
          lVar25 = 0xc0;
          do {
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_218 + lVar25));
            lVar25 = lVar25 + -0x18;
          } while (lVar25 != -0x18);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_118);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
          this_01 = (QArrayDataPointer<QString> *)&match_1;
LAB_00108312:
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_238);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&ok);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_98);
          QRegularExpression::~QRegularExpression(&newLoggingFormat);
          QRegularExpression::~QRegularExpression(&oldFormats);
          if (lVar12 < (long)local_338) goto LAB_0010835e;
          TestRunnerSystemSemaphore::acquire(&testRunnerLock);
          local_298.size = 0xaaaaaaaaaaaaaaaa;
          local_298.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_298.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
          latin1_15.m_data = "install";
          latin1_15.m_size = 7;
          QString::QString((QString *)local_218,latin1_15);
          latin1_16.m_data = "-r";
          latin1_16.m_size = 2;
          QString::QString((QString *)(local_218 + 0x18),latin1_16);
          latin1_17.m_data = "-g";
          latin1_17.m_size = 2;
          QString::QString(&local_1e8,latin1_17);
          local_1d0.d.d = g_options.apkPath.d.d;
          local_1d0.d.ptr = g_options.apkPath.d.ptr;
          local_1d0.d.size = g_options.apkPath.d.size;
          if (g_options.apkPath.d.d != (Data *)0x0) {
            LOCK();
            ((g_options.apkPath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((g_options.apkPath.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          args_02._M_len = 4;
          args_02._M_array = (iterator)local_218;
          QList<QString>::QList((QList<QString> *)&local_298,args_02);
          lVar12 = 0x48;
          do {
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
            lVar12 = lVar12 + -0x18;
          } while (lVar12 != -0x18);
          g_testInfo.isPackageInstalled._M_base._M_i =
               (__atomic_base<bool>)execAdbCommand((QStringList *)&local_298,(QByteArray *)0x0,true)
          ;
          LOCK();
          UNLOCK();
          if ((bool)g_testInfo.isPackageInstalled._M_base._M_i) {
            this_00 = QList<QList<QString>_>::begin(&g_options.preTestRunAdbCommands);
            iVar17 = QList<QList<QString>_>::end(&g_options.preTestRunAdbCommands);
            iVar24 = 0;
LAB_00108483:
            if (this_00.i != iVar17.i) goto code_r0x0010848c;
            local_d8.size = -0x5555555555555556;
            local_d8.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_d8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
            pcVar22 = "%Y-%m-%d %H:%M:%S.%3N";
            if (g_testInfo.sdkVersion < 0x18) {
              pcVar22 = "%m-%d %H:%M:%S.000";
            }
            latin1_18.m_size = (ulong)(0x17 < g_testInfo.sdkVersion) * 3 + 0x12;
            latin1_18.m_data = pcVar22;
            QString::QString((QString *)&match,latin1_18);
            local_88 = 0xaaaaaaaaaaaaaaaa;
            local_98 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
            pQStack_90 = (QString *)0xaaaaaaaaaaaaaaaa;
            latin1_19.m_data = "shell";
            latin1_19.m_size = 5;
            QString::QString((QString *)local_218,latin1_19);
            latin1_20.m_data = "date";
            latin1_20.m_size = 4;
            QString::QString((QString *)(local_218 + 0x18),latin1_20);
            local_58.size = -0x5555555555555556;
            local_58.d = (Data *)CONCAT71(local_58.d._1_7_,1);
            local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
            pcStack_b0 = (char16_t *)0x0;
            QVar53.m_size = (size_t)"+\'%1\'";
            QVar53.field_0.m_data = &local_1e8;
            _ok = &local_58;
            QtPrivate::argToQString(QVar53,0x4000000000000005,(ArgBase **)0x1);
            args_03._M_len = 3;
            args_03._M_array = (QString *)local_218;
            QList<QString>::QList((QList<QString> *)local_98,args_03);
            lVar12 = 0x30;
            do {
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
              lVar12 = lVar12 + -0x18;
            } while (lVar12 != -0x18);
            local_58.d = (Data *)0x0;
            local_58.ptr = (QString *)0x0;
            local_58.size = 0;
            bVar10 = execAdbCommand((QStringList *)local_98,(QByteArray *)&local_58,false);
            if (bVar10) {
              QByteArray::simplified_helper((QByteArray *)local_218);
              QString::fromUtf8<void>((QString *)&local_d8,(QByteArray *)local_218);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_218);
            }
            else {
              local_218._0_4_ = 2;
              local_218._4_4_ = 0;
              local_218._8_2_ = L'\0';
              local_218._10_2_ = 0;
              local_218._12_4_ = 0;
              local_218._16_4_ = 0;
              local_218._20_4_ = 0;
              local_218._24_8_ = "default";
              QMessageLogger::warning();
              QDebug::operator<<((QDebug *)&ok,"Date/time adb command failed");
              QDebug::~QDebug((QDebug *)&ok);
              local_d8.d = (Data *)0x0;
              local_d8.ptr = (char16_t *)0x0;
              local_d8.size = 0;
            }
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
            QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_98);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
            bVar10 = execAdbCommand(&g_options.amStarttestArgs,(QByteArray *)0x0,true);
            iVar24 = -1;
            if (bVar10) {
              local_218._0_4_ = 0xaaaaaaaa;
              local_218._4_4_ = 0xaaaaaaaa;
              local_218._8_2_ = L'ꪪ';
              local_218._10_2_ = 0xaaaa;
              local_218._12_4_ = 0xaaaaaaaa;
              QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_218,10000,CoarseTimer);
              while (g_testInfo.pid = getPid(&g_options.package), g_testInfo.pid < 1) {
                QThread::msleep(100);
                cVar9 = QDeadlineTimer::hasExpired();
                if ((cVar9 != '\0') ||
                   (((byte)g_testInfo.isTestRunnerInterrupted._M_base._M_i & 1) != 0)) break;
              }
              local_58.size = -0x5555555555555556;
              local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
              local_218._20_4_ = (uint)((ulong)g_options.stdoutFileName.d.size >> 0x20) | 0x80000000
              ;
              local_218[0] = (QProcessEnvironment)0x1;
              local_218._8_2_ = SUB82(g_options.stdoutFileName.d.ptr,0);
              local_218._10_2_ = (undefined2)((ulong)g_options.stdoutFileName.d.ptr >> 0x10);
              local_218._12_4_ = (undefined4)((ulong)g_options.stdoutFileName.d.ptr >> 0x20);
              local_218._16_4_ = (undefined4)g_options.stdoutFileName.d.size;
              QVar54.m_size = (size_t)"ls files/%1";
              QVar54.field_0.m_data = &local_58;
              _match = (QDeadlineTimer *)local_218;
              QtPrivate::argToQString(QVar54,0x400000000000000b,(ArgBase **)0x1);
              _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
              latin1_21.m_data = "shell";
              latin1_21.m_size = 5;
              QString::QString((QString *)local_218,latin1_21);
              runCommandAsUserArgs((QString *)(local_218 + 0x18),(QString *)&local_58);
              args_04._M_len = 2;
              args_04._M_array = (QString *)local_218;
              QList<QString>::QList((QList<QString> *)&match,args_04);
              lVar12 = 0x18;
              do {
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
                lVar12 = lVar12 + -0x18;
              } while (lVar12 != -0x18);
              local_218._0_4_ = 0xaaaaaaaa;
              local_218._4_4_ = 0xaaaaaaaa;
              local_218._8_2_ = L'ꪪ';
              local_218._10_2_ = 0xaaaa;
              local_218._12_4_ = 0xaaaaaaaa;
              QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_218,5000,CoarseTimer);
              while (bVar10 = execAdbCommand((QStringList *)&match,(QByteArray *)0x0,false), !bVar10
                    ) {
                QThread::msleep(100);
                cVar9 = QDeadlineTimer::hasExpired();
                if ((cVar9 != '\0') ||
                   (((byte)g_testInfo.isTestRunnerInterrupted._M_base._M_i & 1) != 0)) break;
              }
              QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&match);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_58);
              local_58.size = 0xaaaaaaaaaaaaaaaa;
              local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
              local_218._20_4_ = (uint)((ulong)g_options.stdoutFileName.d.size >> 0x20) | 0x80000000
              ;
              local_218[0] = (QProcessEnvironment)0x1;
              local_218._8_2_ = SUB82(g_options.stdoutFileName.d.ptr,0);
              local_218._10_2_ = (undefined2)((ulong)g_options.stdoutFileName.d.ptr >> 0x10);
              local_218._12_4_ = (undefined4)((ulong)g_options.stdoutFileName.d.ptr >> 0x20);
              local_218._16_4_ = (undefined4)g_options.stdoutFileName.d.size;
              QVar55.m_size = (size_t)"tail -n +1 -f files/%1";
              QVar55.field_0.m_data = &local_58;
              _match = (QDeadlineTimer *)local_218;
              QtPrivate::argToQString(QVar55,0x4000000000000016,(ArgBase **)0x1);
              _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
              latin1_22.m_data = "shell";
              latin1_22.m_size = 5;
              QString::QString((QString *)local_218,latin1_22);
              runCommandAsUserArgs((QString *)(local_218 + 0x18),(QString *)&local_58);
              args_05._M_len = 2;
              args_05._M_array = (QString *)local_218;
              QList<QString>::QList((QList<QString> *)&match,args_05);
              lVar12 = 0x18;
              do {
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
                lVar12 = lVar12 + -0x18;
              } while (lVar12 != -0x18);
              std::optional<QProcess>::emplace<>(&g_options.stdoutLogger);
              pQVar18 = std::
                        _Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                        ::_M_get((_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                                  *)&g_options.stdoutLogger);
              QProcess::setProcessChannelMode((ProcessChannelMode)pQVar18);
              pQVar18 = std::
                        _Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                        ::_M_get((_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                                  *)&g_options.stdoutLogger);
              QProcess::start(pQVar18,0x114090,&match,3);
              pQVar18 = std::
                        _Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                        ::_M_get((_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                                  *)&g_options.stdoutLogger);
              cVar9 = QProcess::waitForStarted((int)pQVar18);
              if (cVar9 == '\0') {
                local_218._0_4_ = 2;
                local_218._4_4_ = 0;
                local_218._8_2_ = L'\0';
                local_218._10_2_ = 0;
                local_218._12_4_ = 0;
                local_218._16_4_ = 0;
                local_218._20_4_ = 0;
                local_218._24_8_ = "default";
                QMessageLogger::critical();
                QDebug::operator<<((QDebug *)local_98,
                                   "Error: failed to run adb command to fetch stdout test results.")
                ;
                QDebug::~QDebug((QDebug *)local_98);
                std::_Optional_payload_base<QProcess>::_M_reset
                          ((_Optional_payload_base<QProcess> *)&g_options.stdoutLogger);
                QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&match)
                ;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_58);
              }
              else {
                QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&match)
                ;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_58);
                local_238.d = (Data *)0xaaaaaaaaaaaaaaaa;
                local_238.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
                QDeadlineTimer::QDeadlineTimer
                          ((QDeadlineTimer *)&local_238,(long)g_options.timeoutSecs * 1000,
                           CoarseTimer);
                if (0 < g_testInfo.pid) {
                  local_338 = 0x4000000000000004;
                  while( true ) {
                    _match = (QDeadlineTimer *)0x0;
                    local_88 = 0xaaaaaaaaaaaaaaaa;
                    local_98 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
                    pQStack_90 = (QString *)0xaaaaaaaaaaaaaaaa;
                    latin1_23.m_data = "shell";
                    latin1_23.m_size = 5;
                    QString::QString((QString *)local_218,latin1_23);
                    latin1_24.m_data = "ps";
                    latin1_24.m_size = 2;
                    QString::QString((QString *)(local_218 + 0x18),latin1_24);
                    latin1_25.m_data = "-p";
                    latin1_25.m_size = 2;
                    QString::QString(&local_1e8,latin1_25);
                    QString::number((int)&local_338 + 0x168,g_testInfo.pid);
                    latin1_26.m_data = "|";
                    latin1_26.m_size = 1;
                    QString::QString(&local_1b8,latin1_26);
                    latin1_27.m_data = "grep";
                    latin1_27.m_size = 4;
                    QString::QString(&local_1a0,latin1_27);
                    latin1_28.m_data = "-o";
                    latin1_28.m_size = 2;
                    QString::QString(&local_188,latin1_28);
                    local_58.size = g_options.package.d.size | 0x8000000000000000;
                    local_58.d = (Data *)CONCAT71(local_58.d._1_7_,1);
                    local_58.ptr = (QString *)g_options.package.d.ptr;
                    _ok = &local_58;
                    pcStack_b0 = (char16_t *)0x0;
                    QVar56.m_size = (size_t)" %1$";
                    QVar56.field_0.m_data = &local_170;
                    QtPrivate::argToQString(QVar56,local_338,(ArgBase **)0x1);
                    args_06._M_len = 8;
                    args_06._M_array = (QString *)local_218;
                    QList<QString>::QList((QList<QString> *)local_98,args_06);
                    lVar12 = 0xa8;
                    do {
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
                      lVar12 = lVar12 + -0x18;
                    } while (lVar12 != -0x18);
                    iVar24 = 3;
                    while( true ) {
                      bVar10 = iVar24 == 0;
                      iVar24 = iVar24 + -1;
                      if (bVar10) {
                        QArrayDataPointer<QString>::~QArrayDataPointer
                                  ((QArrayDataPointer<QString> *)local_98);
                        QArrayDataPointer<char>::~QArrayDataPointer
                                  ((QArrayDataPointer<char> *)&match);
                        goto LAB_00108fe2;
                      }
                      bVar10 = execAdbCommand((QStringList *)local_98,(QByteArray *)&match,false);
                      if (bVar10) break;
                      QThread::msleep(0xfa);
                    }
                    QByteArray::trimmed_helper((QByteArray *)local_218);
                    QString::toUtf8_helper((QString *)&local_58);
                    bVar10 = operator==((QByteArray *)local_218,(QByteArray *)&local_58);
                    QArrayDataPointer<char>::~QArrayDataPointer
                              ((QArrayDataPointer<char> *)&local_58);
                    QArrayDataPointer<char>::~QArrayDataPointer
                              ((QArrayDataPointer<char> *)local_218);
                    QArrayDataPointer<QString>::~QArrayDataPointer
                              ((QArrayDataPointer<QString> *)local_98);
                    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&match);
                    if (!bVar10) break;
                    QThread::msleep(0xfa);
                    cVar9 = QDeadlineTimer::hasExpired();
                    if (((cVar9 != '\0') ||
                        (((byte)g_testInfo.isTestRunnerInterrupted._M_base._M_i & 1) != 0)) ||
                       (g_testInfo.pid < 1)) break;
                  }
                }
LAB_00108fe2:
                cVar9 = QDeadlineTimer::hasExpired();
                if (cVar9 != '\0') {
                  local_218._0_4_ = 2;
                  local_218._4_4_ = 0;
                  local_218._8_2_ = L'\0';
                  local_218._10_2_ = 0;
                  local_218._12_4_ = 0;
                  local_218._16_4_ = 0;
                  local_218._20_4_ = 0;
                  local_218._24_8_ = "default";
                  QMessageLogger::warning();
                  QDebug::operator<<((QDebug *)&local_58,
                                     "Timed out while waiting for the test to finish");
                  QDebug::~QDebug((QDebug *)&local_58);
                }
                if (g_options.stdoutLogger.super__Optional_base<QProcess,_false,_false>._M_payload.
                    super__Optional_payload<QProcess,_true,_false,_false>.
                    super__Optional_payload_base<QProcess>._M_engaged == false) {
                  local_218._0_4_ = 2;
                  local_218._4_4_ = 0;
                  local_218._8_2_ = L'\0';
                  local_218._10_2_ = 0;
                  local_218._12_4_ = 0;
                  local_218._16_4_ = 0;
                  local_218._20_4_ = 0;
                  local_218._24_8_ = "default";
                  QMessageLogger::critical();
                  QDebug::operator<<((QDebug *)&local_58,
                                     "Trying to stop the stdout logger process while it\'s been uninitialised"
                                    );
                  QDebug::~QDebug((QDebug *)&local_58);
LAB_0010905e:
                  local_58.size = 0;
                  local_58.d = (Data *)0x0;
                  local_58.ptr = (QString *)0x0;
                  _match = (QDeadlineTimer *)0xaaaaaaaaaaaaaaaa;
                  latin1_29.m_data = "cat files/qtest_last_exit_code 2> /dev/null";
                  latin1_29.m_size = 0x2b;
                  QString::QString((QString *)&match,latin1_29);
                  latin1_30.m_data = "shell";
                  latin1_30.m_size = 5;
                  QString::QString((QString *)local_218,latin1_30);
                  runCommandAsUserArgs((QString *)(local_218 + 0x18),(QString *)&match);
                  args_07._M_len = 2;
                  args_07._M_array = (iterator)local_218;
                  QList<QString>::QList((QList<QString> *)local_98,args_07);
                  bVar10 = execAdbCommand((QStringList *)local_98,(QByteArray *)&local_58,false);
                  QArrayDataPointer<QString>::~QArrayDataPointer
                            ((QArrayDataPointer<QString> *)local_98);
                  lVar12 = 0x18;
                  do {
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
                    lVar12 = lVar12 + -0x18;
                  } while (lVar12 != -0x18);
                  if (bVar10) {
                    local_218[0] = (QProcessEnvironment)0xaa;
                    iVar11 = QByteArray::toInt((bool *)&local_58,(int)local_218);
                    iVar24 = -1;
                    if (local_218[0] != (QProcessEnvironment)0x0) {
                      iVar24 = iVar11;
                    }
                  }
                  else {
                    local_218._0_4_ = 2;
                    local_218._4_4_ = 0;
                    local_218._8_2_ = L'\0';
                    local_218._10_2_ = 0;
                    local_218._12_4_ = 0;
                    local_218._16_4_ = 0;
                    local_218._20_4_ = 0;
                    local_218._24_8_ = "default";
                    QMessageLogger::critical();
                    QDebug::operator<<((QDebug *)local_98,"Failed to retrieve the test exit code.");
                    QDebug::~QDebug((QDebug *)local_98);
                    iVar24 = -1;
                  }
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&match);
                  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
                  exitCode = iVar24;
                  analyseLogcat((QString *)&local_d8,&exitCode);
                  local_118 = (piter)QHash<QString,_QString>::constBegin(&g_options.outFiles);
                  local_338 = 0x4000000000000019;
                  while( true ) {
                    if (local_118.d == (Data<QHashPrivate::Node<QString,_QString>_> *)0x0 &&
                        local_118.bucket == 0) break;
                    pSVar4 = (local_118.d)->spans;
                    uVar20 = local_118.bucket >> 7;
                    pEVar5 = pSVar4[uVar20].entries;
                    bVar1 = pSVar4[uVar20].offsets[(uint)local_118.bucket & 0x7f];
                    _match = *(QDeadlineTimer **)(pEVar5[bVar1].storage.data + 0x18);
                    pQVar21 = *(QString **)(pEVar5[bVar1].storage.data + 0x20);
                    uVar20 = *(ulong *)(pEVar5[bVar1].storage.data + 0x28);
                    if (_match != (QDeadlineTimer *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)_match)->d).d = *(int *)&(((QString *)_match)->d).d + 1;
                      UNLOCK();
                    }
                    local_88 = 0xaaaaaaaaaaaaaaaa;
                    local_98 = (undefined1  [8])0xaaaaaaaaaaaaaaaa;
                    pQStack_90 = (QString *)0xaaaaaaaaaaaaaaaa;
                    QFileInfo::QFileInfo((QFileInfo *)local_218,(QString *)&match);
                    QFileInfo::fileName();
                    QFileInfo::~QFileInfo((QFileInfo *)local_218);
                    local_a8 = -0x5555555555555556;
                    _ok = (QArrayDataPointer<QString> *)0xaaaaaaaaaaaaaaaa;
                    pcStack_b0 = (char16_t *)0xaaaaaaaaaaaaaaaa;
                    local_218._20_4_ = (uint)(local_88 >> 0x20) | 0x80000000;
                    local_218[0] = (QProcessEnvironment)0x1;
                    local_218._8_2_ = SUB82(pQStack_90,0);
                    local_218._10_2_ = (undefined2)((ulong)pQStack_90 >> 0x10);
                    local_218._12_4_ = (undefined4)((ulong)pQStack_90 >> 0x20);
                    local_218._16_4_ = (undefined4)local_88;
                    local_58.ptr = (QString *)0x0;
                    QVar57.m_size = (size_t)"cat files/%1 2> /dev/null";
                    QVar57.field_0.m_data = &ok;
                    local_58.d = (Data *)local_218;
                    QtPrivate::argToQString(QVar57,local_338,(ArgBase **)0x1);
                    local_238.size = -0x5555555555555556;
                    local_238.d = (Data *)0xaaaaaaaaaaaaaaaa;
                    local_238.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
                    latin1_31.m_data = "shell";
                    latin1_31.m_size = 5;
                    QString::QString((QString *)local_218,latin1_31);
                    runCommandAsUserArgs((QString *)(local_218 + 0x18),(QString *)&ok);
                    args_08._M_len = 2;
                    args_08._M_array = (iterator)local_218;
                    QList<QString>::QList((QList<QString> *)&local_238,args_08);
                    lVar12 = 0x18;
                    do {
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
                      lVar12 = lVar12 + -0x18;
                    } while (lVar12 != -0x18);
                    local_258.size = 0;
                    local_258.d = (Data *)0x0;
                    local_258.ptr = (char16_t *)0x0;
                    bVar10 = false;
                    for (iVar24 = 1; iVar24 <= g_options.resultsPullRetries; iVar24 = iVar24 + 1) {
                      bVar10 = execAdbCommand((QStringList *)&local_238,(QByteArray *)&local_258,
                                              false);
                      if ((bVar10) && (local_258.size != 0)) goto LAB_001093c8;
                    }
                    if (bVar10 == false) {
                      local_218._0_4_ = 2;
                      local_218._4_4_ = 0;
                      local_218._8_2_ = L'\0';
                      local_218._10_2_ = 0;
                      local_218._12_4_ = 0;
                      local_218._16_4_ = 0;
                      local_218._20_4_ = 0;
                      local_218._24_8_ = "default";
                      QMessageLogger::critical();
                      uVar20 = 0x4000000000000032;
                      pcVar22 = "Error: failed to retrieve the test result file %1.";
LAB_00109932:
                      local_58.size = local_88 | 0x8000000000000000;
                      _match_1 = &local_58;
                      local_58.d = (Data *)CONCAT71(local_58.d._1_7_,1);
                      QVar59.m_size = (size_t)pcVar22;
                      QVar59.field_0.m_data = &local_270;
                      local_58.ptr = pQStack_90;
                      QtPrivate::argToQString(QVar59,uVar20,(ArgBase **)0x1);
                      QDebug::operator<<((QDebug *)&local_2b8,(QString *)&local_270);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
                      QDebug::~QDebug((QDebug *)&local_2b8);
                      QArrayDataPointer<char>::~QArrayDataPointer
                                ((QArrayDataPointer<char> *)&local_258);
                      QArrayDataPointer<QString>::~QArrayDataPointer(&local_238);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&ok);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)local_98);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                ((QArrayDataPointer<char16_t> *)&match);
LAB_001099a1:
                      exitCode = -1;
                      break;
                    }
                    if (local_258.size == 0) {
                      local_218._0_4_ = 2;
                      local_218._4_4_ = 0;
                      local_218._8_2_ = L'\0';
                      local_218._10_2_ = 0;
                      local_218._12_4_ = 0;
                      local_218._16_4_ = 0;
                      local_218._20_4_ = 0;
                      local_218._24_8_ = "default";
                      QMessageLogger::critical();
                      uVar20 = 0x4000000000000028;
                      pcVar22 = "Error: the test result file %1 is empty.";
                      goto LAB_00109932;
                    }
LAB_001093c8:
                    local_2b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
                    local_2b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                    QFile::QFile((QFile *)&local_2b8,(QString *)&match);
                    cVar9 = QFile::open(&local_2b8,2);
                    if (cVar9 == '\0') {
                      local_218._0_4_ = 2;
                      local_218._4_4_ = 0;
                      local_218._8_2_ = L'\0';
                      local_218._10_2_ = 0;
                      local_218._12_4_ = 0;
                      local_218._16_4_ = 0;
                      local_218._20_4_ = 0;
                      local_218._24_8_ = "default";
                      QMessageLogger::critical();
                      local_58.size = uVar20 | 0x8000000000000000;
                      local_58.d = (Data *)CONCAT71(local_58.d._1_7_,1);
                      _match_1 = &local_58;
                      QVar58.m_size = (size_t)"Error: failed to open %1 to write results to host.";
                      QVar58.field_0.m_data = &local_270;
                      local_58.ptr = pQVar21;
                      QtPrivate::argToQString(QVar58,0x4000000000000032,(ArgBase **)0x1);
                      QDebug::operator<<((QDebug *)local_138,(QString *)&local_270);
                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_270);
                      QDebug::~QDebug((QDebug *)local_138);
                    }
                    else {
                      QIODevice::write((QByteArray *)&local_2b8);
                    }
                    QFile::~QFile((QFile *)&local_2b8);
                    QArrayDataPointer<char>::~QArrayDataPointer
                              ((QArrayDataPointer<char> *)&local_258);
                    QArrayDataPointer<QString>::~QArrayDataPointer(&local_238);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&ok);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_98);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)&match);
                    if (cVar9 == '\0') goto LAB_001099a1;
                    QHashPrivate::iterator<QHashPrivate::Node<QString,_QString>_>::operator++
                              (&local_118);
                  }
                  latin1_32.m_data = "uninstall";
                  latin1_32.m_size = 9;
                  QString::QString((QString *)local_218,latin1_32);
                  local_218._24_8_ = g_options.package.d.d;
                  local_1f8 = g_options.package.d.ptr;
                  qStack_1f0 = g_options.package.d.size;
                  if (g_options.package.d.d != (Data *)0x0) {
                    LOCK();
                    ((g_options.package.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((g_options.package.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                  args_09._M_len = 2;
                  args_09._M_array = (iterator)local_218;
                  QList<QString>::QList((QList<QString> *)&local_58,args_09);
                  bVar10 = execAdbCommand((QStringList *)&local_58,(QByteArray *)0x0,true);
                  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
                  lVar12 = 0x18;
                  do {
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)(local_218 + lVar12));
                    lVar12 = lVar12 + -0x18;
                  } while (lVar12 != -0x18);
                  iVar24 = -1;
                  if ((!bVar10) ||
                     (TestRunnerSystemSemaphore::release(&testRunnerLock), iVar24 = exitCode,
                     ((byte)g_testInfo.isTestRunnerInterrupted._M_base._M_i & 1) == 0))
                  goto LAB_00109a9e;
                  local_218._0_4_ = 2;
                  local_218._4_4_ = 0;
                  local_218._8_2_ = L'\0';
                  local_218._10_2_ = 0;
                  local_218._12_4_ = 0;
                  local_218._16_4_ = 0;
                  local_218._20_4_ = 0;
                  local_218._24_8_ = "default";
                  QMessageLogger::critical();
                  pcVar22 = "The androidtestrunner was interrupted and the was test cleaned up.";
                }
                else {
                  std::_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>::
                  _M_get((_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                          *)&g_options.stdoutLogger);
                  iVar24 = QProcess::state();
                  if (iVar24 == 0) {
                    local_218._0_4_ = 2;
                    local_218._4_4_ = 0;
                    local_218._8_2_ = L'\0';
                    local_218._10_2_ = 0;
                    local_218._12_4_ = 0;
                    local_218._16_4_ = 0;
                    local_218._20_4_ = 0;
                    local_218._24_8_ = "default";
                    QMessageLogger::critical();
                    pcVar22 = 
                    "The stdout logger process was terminated unexpectedly, It might have been terminated by an external process"
                    ;
                  }
                  else {
                    std::_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                    ::_M_get((_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                              *)&g_options.stdoutLogger);
                    QProcess::terminate();
                    pQVar18 = std::
                              _Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                              ::_M_get((_Optional_base_impl<QProcess,_std::_Optional_base<QProcess,_false,_false>_>
                                        *)&g_options.stdoutLogger);
                    cVar9 = QProcess::waitForFinished((int)pQVar18);
                    if (cVar9 != '\0') goto LAB_0010905e;
                    local_218._0_4_ = 2;
                    local_218._4_4_ = 0;
                    local_218._8_2_ = L'\0';
                    local_218._10_2_ = 0;
                    local_218._12_4_ = 0;
                    local_218._16_4_ = 0;
                    local_218._20_4_ = 0;
                    local_218._24_8_ = "default";
                    QMessageLogger::critical();
                    pcVar22 = "Error: adb test results tail command timed out.";
                  }
                }
                QDebug::operator<<((QDebug *)&local_58,pcVar22);
                QDebug::~QDebug((QDebug *)&local_58);
                iVar24 = -1;
              }
            }
LAB_00109a9e:
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
            goto LAB_00109aab;
          }
          iVar24 = -1;
LAB_00109aab:
          QArrayDataPointer<QString>::~QArrayDataPointer(&local_298);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_328);
      }
      else {
        local_218._0_4_ = 2;
        local_218._20_4_ = 0;
        local_218._4_4_ = 0;
        local_218._8_2_ = L'\0';
        local_218._10_2_ = 0;
        local_218._12_4_ = 0;
        local_218._16_4_ = 0;
        local_218._24_8_ = "default";
        QString::toLocal8Bit((QByteArray *)&local_58,&g_options.makeCommand);
        pQVar21 = local_58.ptr;
        if (local_58.ptr == (QString *)0x0) {
          pQVar21 = (QString *)&QByteArray::_empty;
        }
        pcVar22 = local_308.ptr;
        if (local_308.ptr == (char *)0x0) {
          pcVar22 = (char *)&QByteArray::_empty;
        }
        QMessageLogger::critical
                  (local_218,"The APK build command \"%s\" failed\n\n%s",pQVar21,pcVar22);
LAB_00108e63:
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_308);
      goto LAB_00109acc;
    }
    local_218._0_4_ = 2;
    local_218._20_4_ = 0;
    local_218._4_4_ = 0;
    local_218._8_2_ = L'\0';
    local_218._10_2_ = 0;
    local_218._12_4_ = 0;
    local_218._16_4_ = 0;
    local_218._24_8_ = "default";
    QMessageLogger::critical();
    QDebug::operator<<((QDebug *)&local_58,
                       "It is required to provide a make command with the \"--make\" parameter to generate the apk."
                      );
    QDebug::~QDebug((QDebug *)&local_58);
  }
  else {
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    local_218._0_4_ = 2;
    local_218._20_4_ = 0;
    local_218._4_4_ = 0;
    local_218._8_2_ = L'\0';
    local_218._10_2_ = 0;
    local_218._12_4_ = 0;
    local_218._16_4_ = 0;
    local_218._24_8_ = "default";
    QCoreApplication::arguments();
    QString::toLocal8Bit((QByteArray *)&local_58,pQStack_70);
    pQVar21 = local_58.ptr;
    if (local_58.ptr == (QString *)0x0) {
      pQVar21 = (QString *)&QByteArray::_empty;
    }
    QMessageLogger::warning
              (local_218,
               "Syntax: %s <options> -- [TESTARGS] \n\n  Runs a Qt for Android test on an emulator or a device. Specify a device\n  using the environment variables ANDROID_SERIAL or ANDROID_DEVICE_SERIAL.\n  Returns the number of failed tests, -1 on test runner deployment related\n  failures or zero on success.\n  Mandatory arguments:\n    --path <path>: The path where androiddeployqt builds the android package.\n\n    --make <make cmd>: make command to create an APK, for example:\n       \"cmake --build <build-dir> --target <target>_make_apk\".\n\n    --apk <apk path>: The test apk path. The apk has to exist already, if it\n       does not exist the make command must be provided for building the apk.\n\n  Optional arguments:\n    --adb <adb cmd>: The Android ADB command. If missing the one from\n       $PATH will be used.\n\n    --activity <acitvity>: The Activity to run. If missing the first\n       activity from AndroidManifest.qml file will be used.\n\n    --timeout <seconds>: Timeout to run the test. Default is 10 minutes.\n\n    --skip-install-root: Do not append INSTALL_ROOT=... to the make command.\n\n    --show-logcat: Print Logcat output to stdout. If an ANR occurs during\n       the test run, logs from the system_server process are included.\n       This argument is implied if a test crashes.\n\n    --ndk-stack: Path to ndk-stack tool that symbolizes crash stacktraces.\n       By default, ANDROID_NDK_ROOT env var is used to deduce the tool path.\n\n    -- Arguments that will be passed to the test application.\n\n    --verbose: Prints out information during processing.\n\n    --pre-test-adb-command <command>: call the adb <command> after\n       installation and before the test run.\n\n    --manifest <path>: Custom path to the AndroidManifest.xml.\n\n    --help: Displays this information.\n"
               ,pQVar21);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&match);
  }
  iVar24 = -1;
LAB_00109acc:
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_2e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar24;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char *argv[])
{
    std::signal(SIGINT,  sigHandler);
    std::signal(SIGTERM, sigHandler);

    QCoreApplication a(argc, argv);
    if (!parseOptions()) {
        printHelp();
        return EXIT_ERROR;
    }

    if (g_options.makeCommand.isEmpty()) {
        qCritical() << "It is required to provide a make command with the \"--make\" parameter "
                       "to generate the apk.";
        return EXIT_ERROR;
    }

    QByteArray buildOutput;
    if (!execCommand(g_options.makeCommand, &buildOutput, true)) {
        qCritical("The APK build command \"%s\" failed\n\n%s",
            qPrintable(g_options.makeCommand), buildOutput.constData());
        return EXIT_ERROR;
    }

    if (!QFile::exists(g_options.apkPath)) {
        qCritical("No apk \"%s\" found after running the make command. "
                  "Check the provided path and the make command.",
                  qPrintable(g_options.apkPath));
        return EXIT_ERROR;
    }

    const QStringList devices = runningDevices();
    if (devices.isEmpty()) {
        qCritical("No connected devices or running emulators can be found.");
        return EXIT_ERROR;
    } else if (!g_options.serial.isEmpty() && !devices.contains(g_options.serial)) {
        qCritical("No connected device or running emulator with serial '%s' can be found.",
                  qPrintable(g_options.serial));
        return EXIT_ERROR;
    }

    obtainSdkVersion();

    g_testInfo.userId = userId();

    if (!QFile::exists(g_options.manifestPath)) {
        qCritical("Unable to find '%s'.", qPrintable(g_options.manifestPath));
        return EXIT_ERROR;
    }
    g_options.package = packageNameFromAndroidManifest(g_options.manifestPath);
    if (g_options.activity.isEmpty())
        g_options.activity = activityFromAndroidManifest(g_options.manifestPath);

    // parseTestArgs depends on g_options.package
    if (!parseTestArgs())
        return EXIT_ERROR;

    // do not install or run packages while another test is running
    testRunnerLock.acquire();

    const QStringList installArgs = { "install"_L1, "-r"_L1, "-g"_L1, g_options.apkPath };
    g_testInfo.isPackageInstalled.store(execAdbCommand(installArgs, nullptr));
    if (!g_testInfo.isPackageInstalled)
        return EXIT_ERROR;

    // Call additional adb command if set after installation and before starting the test
    for (const auto &command : g_options.preTestRunAdbCommands) {
        QByteArray output;
        if (!execAdbCommand(command, &output)) {
            qCritical("The pre test ADB command \"%s\" failed with output:\n%s",
                  qUtf8Printable(command.join(u' ')), output.constData());
            return EXIT_ERROR;
        }
    }

    // Pre test start
    const QString formattedStartTime = getCurrentTimeString();

    // Start the test
    if (!execAdbCommand(g_options.amStarttestArgs, nullptr))
        return EXIT_ERROR;

    waitForStarted();
    waitForLoggingStarted();

    if (!setupStdoutLogger())
        return EXIT_ERROR;

    waitForFinished();

    // Post test run
    if (!stopStdoutLogger())
        return EXIT_ERROR;

    int exitCode = testExitCode();

    analyseLogcat(formattedStartTime, &exitCode);

    exitCode = pullResults() ? exitCode : EXIT_ERROR;

    if (!uninstallTestPackage())
        return EXIT_ERROR;

    testRunnerLock.release();

    if (g_testInfo.isTestRunnerInterrupted.load()) {
        qCritical() << "The androidtestrunner was interrupted and the was test cleaned up.";
        return EXIT_ERROR;
    }

    return exitCode;
}